

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::Function::RegisterBlock(Function *this,uint32_t block_id,bool is_definition)

{
  value_type *__v;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  pVar1;
  uint32_t block_id_local;
  uint32_t local_178 [2];
  BasicBlock local_170;
  BasicBlock local_d0;
  
  block_id_local = block_id;
  if (this->declaration_type_ != kFunctionDeclDefinition) {
    __assert_fail("declaration_type_ == FunctionDecl::kFunctionDeclDefinition && \"RegisterBlocks can only be called after declaration_type_ is defined\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                  ,0x79,"spv_result_t spvtools::val::Function::RegisterBlock(uint32_t, bool)");
  }
  BasicBlock::BasicBlock(&local_d0,block_id);
  local_170.id_ = local_d0.id_;
  local_170._4_4_ = local_d0._4_4_;
  local_170.immediate_dominator_ = local_d0.immediate_dominator_;
  local_170.immediate_structural_dominator_ = local_d0.immediate_structural_dominator_;
  local_170.immediate_structural_post_dominator_ = local_d0.immediate_structural_post_dominator_;
  local_170.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ =
       local_d0.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  local_170.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ =
       local_d0.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  local_170.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ =
       local_d0.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  local_170.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       local_d0.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_170.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d0.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_d0.successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_170.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_d0.successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_170.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d0.successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.type_.super__Base_bitset<1UL>._M_w = local_d0.type_.super__Base_bitset<1UL>._M_w;
  local_170.reachable_ = local_d0.reachable_;
  local_170.structurally_reachable_ = local_d0.structurally_reachable_;
  local_170._90_6_ = local_d0._90_6_;
  local_170.label_ = local_d0.label_;
  local_170.terminator_ = local_d0.terminator_;
  local_170.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_d0.structural_predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_170.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_d0.structural_predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_170.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d0.structural_predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ =
       local_d0.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  local_170.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ =
       local_d0.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  local_170.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ =
       local_d0.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  local_170.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       local_d0.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_170.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d0.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178[0] = block_id;
  pVar1 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->blocks_,local_178);
  BasicBlock::~BasicBlock(&local_170);
  BasicBlock::~BasicBlock(&local_d0);
  if (is_definition) {
    if (this->current_block_ != (BasicBlock *)0x0) {
      __assert_fail("current_block_ == nullptr && \"Register Block can only be called when parsing a binary outside of \" \"a BasicBlock\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                    ,0x82,"spv_result_t spvtools::val::Function::RegisterBlock(uint32_t, bool)");
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->undefined_blocks_)._M_h,&block_id_local);
    this->current_block_ =
         (BasicBlock *)
         ((long)pVar1.first.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
         + 0x10);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(&this->ordered_blocks_,&this->current_block_);
  }
  else if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((__ireturn_type *)&this->undefined_blocks_,
             (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&block_id_local,__v);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterBlock(uint32_t block_id, bool is_definition) {
  assert(
      declaration_type_ == FunctionDecl::kFunctionDeclDefinition &&
      "RegisterBlocks can only be called after declaration_type_ is defined");

  std::unordered_map<uint32_t, BasicBlock>::iterator inserted_block;
  bool success = false;
  tie(inserted_block, success) =
      blocks_.insert({block_id, BasicBlock(block_id)});
  if (is_definition) {  // new block definition
    assert(current_block_ == nullptr &&
           "Register Block can only be called when parsing a binary outside of "
           "a BasicBlock");

    undefined_blocks_.erase(block_id);
    current_block_ = &inserted_block->second;
    ordered_blocks_.push_back(current_block_);
  } else if (success) {  // Block doesn't exist but this is not a definition
    undefined_blocks_.insert(block_id);
  }

  return SPV_SUCCESS;
}